

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_asn1.cc
# Opt level: O0

ECDSA_SIG * ECDSA_SIG_from_bytes(uint8_t *in,size_t in_len)

{
  size_t sVar1;
  ECDSA_SIG *ret;
  CBS cbs;
  size_t in_len_local;
  uint8_t *in_local;
  
  cbs.len = in_len;
  CBS_init((CBS *)&ret,in,in_len);
  in_local = (uint8_t *)ECDSA_SIG_parse((CBS *)&ret);
  if (((ECDSA_SIG *)in_local == (ECDSA_SIG *)0x0) || (sVar1 = CBS_len((CBS *)&ret), sVar1 != 0)) {
    ERR_put_error(0x1a,0,100,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdsa/ecdsa_asn1.cc"
                  ,0x105);
    ECDSA_SIG_free((ECDSA_SIG *)in_local);
    in_local = (uint8_t *)0x0;
  }
  return (ECDSA_SIG *)in_local;
}

Assistant:

ECDSA_SIG *ECDSA_SIG_from_bytes(const uint8_t *in, size_t in_len) {
  CBS cbs;
  CBS_init(&cbs, in, in_len);
  ECDSA_SIG *ret = ECDSA_SIG_parse(&cbs);
  if (ret == NULL || CBS_len(&cbs) != 0) {
    OPENSSL_PUT_ERROR(ECDSA, ECDSA_R_BAD_SIGNATURE);
    ECDSA_SIG_free(ret);
    return NULL;
  }
  return ret;
}